

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O3

aom_codec_err_t __thiscall
anon_unknown.dwarf_117e0d7::ExternalFrameBufferTest::SetFrameBufferFunctions
          (ExternalFrameBufferTest *this,int num_buffers,aom_get_frame_buffer_cb_fn_t cb_get,
          aom_release_frame_buffer_cb_fn_t cb_release)

{
  Decoder *this_00;
  undefined8 *puVar1;
  aom_codec_err_t aVar2;
  ExternalFrameBuffer *__s;
  char *in_R9;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  undefined8 *local_48;
  string local_40;
  
  this->num_buffers_ = num_buffers;
  if (num_buffers < 0) {
    local_50[0] = (internal)0x0;
    local_48 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"fb_list_.CreateBufferList(num_buffers_)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
               ,0x157,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
  }
  else {
    (this->fb_list_).num_buffers_ = num_buffers;
    __s = (ExternalFrameBuffer *)operator_new__((ulong)(uint)num_buffers * 0x18);
    (this->fb_list_).ext_fb_list_ = __s;
    memset(__s,0,(ulong)(uint)num_buffers * 0x18);
  }
  this_00 = &this->decoder_->super_Decoder;
  libaom_test::Decoder::InitOnce(this_00);
  aVar2 = aom_codec_set_frame_buffer_functions(&this_00->decoder_,cb_get,cb_release,&this->fb_list_)
  ;
  return aVar2;
}

Assistant:

aom_codec_err_t SetFrameBufferFunctions(
      int num_buffers, aom_get_frame_buffer_cb_fn_t cb_get,
      aom_release_frame_buffer_cb_fn_t cb_release) {
    if (num_buffers > 0) {
      num_buffers_ = num_buffers;
      EXPECT_TRUE(fb_list_.CreateBufferList(num_buffers_));
    }

    return decoder_->SetFrameBufferFunctions(cb_get, cb_release, &fb_list_);
  }